

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

bool __thiscall
boost::ext::ut::v1_1_8::
runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16>::on<bool>
          (runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16> *this,
          assertion<bool> assertion)

{
  assertion_pass<bool> aVar1;
  assertion_fail<bool> assertion_00;
  undefined7 uStack_47;
  undefined4 uStack_34;
  undefined7 uStack_2f;
  undefined4 uStack_1c;
  runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16> *this_local;
  
  if ((this->dry_run_ & 1U) == 0) {
    if (((undefined1  [24])assertion & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
      this->fails_ = this->fails_ + 1;
      assertion_00.location._12_4_ = uStack_34;
      assertion_00.location.line_ = assertion.location.line_;
      assertion_00.location.file_ = assertion.location.file_;
      assertion_00._0_8_ = CONCAT71(uStack_47,assertion.expr) & 0xffffffffffffff01;
      reporter<boost::ext::ut::v1_1_8::printer>::on<bool>(&this->reporter_,assertion_00);
      this_local._7_1_ = false;
    }
    else {
      aVar1.location._12_4_ = uStack_1c;
      aVar1.location.line_ = assertion.location.line_;
      aVar1.location.file_ = assertion.location.file_;
      aVar1._0_8_ = CONCAT71(uStack_2f,assertion.expr) & 0xffffffffffffff01;
      reporter<boost::ext::ut::v1_1_8::printer>::on<bool>(&this->reporter_,aVar1);
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

[[nodiscard]] auto on(events::assertion<TExpr> assertion) -> bool {
      if (dry_run_) {
        return true;
      }

      if (static_cast<bool>(assertion.expr)) {
        reporter_.on(events::assertion_pass<TExpr>{
            .expr = assertion.expr, .location = assertion.location});
        return true;
      } else {
        ++fails_;
        reporter_.on(events::assertion_fail<TExpr>{
            .expr = assertion.expr, .location = assertion.location});
        return false;
      }
    }